

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStreambuf.hh
# Opt level: O0

streamsize __thiscall avro::istreambuf::xsgetn(istreambuf *this,char_type *c,streamsize len)

{
  size_t __n;
  bool bVar1;
  long lVar2;
  long lVar3;
  unsigned_long *puVar4;
  void *__src;
  long in_RDX;
  BufferIterator<avro::detail::InputIteratorHelper> *in_RSI;
  long *in_RDI;
  size_t toCopy;
  size_t remaining;
  size_t inBuffer;
  streamsize bytesCopied;
  this_type *rhs;
  BufferIterator<avro::detail::InputIteratorHelper> *in_stack_ffffffffffffff90;
  InputBuffer *in_stack_ffffffffffffffb8;
  unsigned_long local_30;
  unsigned_long local_28;
  long local_20;
  long local_18;
  BufferIterator<avro::detail::InputIteratorHelper> *local_10;
  
  local_20 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  do {
    do {
      if (local_18 <= local_20) {
        return local_20;
      }
      lVar2 = std::streambuf::egptr();
      lVar3 = std::streambuf::gptr();
      local_28 = lVar2 - lVar3;
      if (local_28 != 0) {
        local_30 = local_18 - local_20;
        puVar4 = std::min<unsigned_long>(&local_28,&local_30);
        __n = *puVar4;
        in_stack_ffffffffffffff90 = local_10;
        __src = (void *)std::streambuf::gptr();
        memcpy(in_stack_ffffffffffffff90,__src,__n);
        local_10 = (BufferIterator<avro::detail::InputIteratorHelper> *)
                   ((long)&(local_10->helper_).iter_._M_cur + __n);
        local_20 = __n + local_20;
        std::streambuf::gbump((int)in_RDI);
      }
    } while (local_18 <= local_20);
    (**(code **)(*in_RDI + 0x48))();
    rhs = (this_type *)(in_RDI + 0xb);
    InputBuffer::end(in_stack_ffffffffffffffb8);
    bVar1 = detail::BufferIterator<avro::detail::InputIteratorHelper>::operator==
                      (in_stack_ffffffffffffff90,rhs);
  } while (!bVar1);
  return local_20;
}

Assistant:

virtual std::streamsize xsgetn(char_type *c, std::streamsize len) 
    {
        std::streamsize bytesCopied = 0;

        while (bytesCopied < len) {

            size_t inBuffer = egptr() - gptr();

            if (inBuffer) {
                size_t remaining = static_cast<size_t>(len - bytesCopied);
                size_t toCopy = std::min(inBuffer, remaining);
                memcpy(c, gptr(), toCopy);
                c += toCopy;
                bytesCopied += toCopy;
                gbump(toCopy);
            }

            if(bytesCopied < len) {
                underflow();
                if(iter_ == buffer_.end()) {
                    break;
                }
            }
        }

        return bytesCopied;
    }